

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::leave_seed_mode(torrent *this,seed_mode_t checking)

{
  ulong uVar1;
  char *pcVar2;
  
  if ((this->field_0x5cc & 4) == 0) {
    return;
  }
  if (checking == check_files) {
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** FAILED SEED MODE, rechecking");
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** LEAVING SEED MODE (%s)","as non-seed");
    this->field_0x5cc = this->field_0x5cc & 0xfb;
    uVar1 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
    if ((~uVar1 & 0xe00000000000000) != 0) {
      *(ulong *)&(this->super_torrent_hot_members).field_0x48 = uVar1 & 0xffffffffbfffffff;
      set_state(this,downloading);
      force_recheck(this);
    }
  }
  else {
    pcVar2 = "as non-seed";
    if (checking == skip_checking) {
      pcVar2 = "as seed";
    }
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** LEAVING SEED MODE (%s)",pcVar2);
    this->field_0x5cc = this->field_0x5cc & 0xfb;
  }
  this->m_num_verified = 0;
  bitfield::clear(&(this->m_verified).super_bitfield);
  bitfield::clear(&(this->m_verifying).super_bitfield);
  set_need_save_resume(this,(resume_data_flags_t)0x40);
  return;
}

Assistant:

void torrent::leave_seed_mode(seed_mode_t const checking)
	{
		if (!m_seed_mode) return;

		if (checking == seed_mode_t::check_files)
		{
			// this means the user promised we had all the
			// files, but it turned out we didn't. This is
			// an error.

			// TODO: 2 post alert

#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** FAILED SEED MODE, rechecking");
#endif
		}

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("*** LEAVING SEED MODE (%s)"
			, checking == seed_mode_t::skip_checking ? "as seed" : "as non-seed");
#endif
		m_seed_mode = false;
		// seed is false if we turned out not
		// to be a seed after all
		if (checking == seed_mode_t::check_files
			&& state() != torrent_status::checking_resume_data)
		{
			m_have_all = false;
			set_state(torrent_status::downloading);
			force_recheck();
		}
		m_num_verified = 0;
		m_verified.clear();
		m_verifying.clear();

		set_need_save_resume(torrent_handle::if_state_changed);
	}